

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O0

size_t axl::io::getSockAddrFamilySize(uint_t family)

{
  uint_t family_local;
  undefined8 local_8;
  
  if (family == 2) {
    local_8 = 0x10;
  }
  else if (family == 10) {
    local_8 = 0x1c;
  }
  else {
    local_8 = 0x10;
  }
  return local_8;
}

Assistant:

size_t
getSockAddrFamilySize(uint_t family) {
	switch (family) {
	case AF_INET:
		return sizeof(sockaddr_in);

	case AF_INET6:
		return sizeof(sockaddr_in6);

	default:
		return sizeof(sockaddr);
	}
}